

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void SpawnDeepSplash(AActor *t1,FTraceResults *trace,AActor *puff)

{
  long lVar1;
  subsector_t *psVar2;
  
  lVar1 = 0xb8;
  if ((trace->Crossed3DWater == (F3DFloor *)0x0) &&
     ((trace->CrossedWater == (sector_t *)0x0 ||
      (lVar1 = 0x98, trace->CrossedWater->heightsec == (sector_t *)0x0)))) {
    return;
  }
  if (puff != (AActor *)0x0) {
    t1 = puff;
  }
  psVar2 = P_PointInSubsector(*(double *)((long)&trace->Sector + lVar1),
                              *(double *)((long)&(trace->HitTexture).texnum + lVar1));
  P_HitWater(t1,(sector_t *)psVar2->sector,(DVector3 *)((long)&trace->Sector + lVar1),false,true,
             false);
  return;
}

Assistant:

static void SpawnDeepSplash(AActor *t1, const FTraceResults &trace, AActor *puff)
{
	const DVector3 *hitpos;
	if (trace.Crossed3DWater)
	{
		hitpos = &trace.Crossed3DWaterPos;
	}
	else if (trace.CrossedWater && trace.CrossedWater->heightsec)
	{
		hitpos = &trace.CrossedWaterPos;
	}
	else return;

	P_HitWater(puff != NULL ? puff : t1, P_PointInSector(*hitpos), *hitpos);
}